

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_f6f6::MovieState::streamComponentOpen(MovieState *this,uint stream_index)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  pointer pAVar4;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  void *this_00;
  uint in_ESI;
  long in_RDI;
  AVCodec *codec;
  AVCodecCtxPtr avctx;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  AVMediaType AVar8;
  unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *in_stack_ffffffffffffff50;
  unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *in_stack_ffffffffffffff60;
  uint local_4;
  
  pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::operator->
                     ((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *)
                      0x111a67);
  if (pAVar3->nb_streams <= in_ESI) {
    return -1;
  }
  avcodec_alloc_context3(0);
  std::unique_ptr<AVCodecContext,(anonymous_namespace)::AVCodecCtxDeleter>::
  unique_ptr<(anonymous_namespace)::AVCodecCtxDeleter,void>
            (in_stack_ffffffffffffff50,
             (pointer)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                     0x111aa9);
  if (bVar1) {
    pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                       (in_stack_ffffffffffffff50);
    pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::operator->
                       ((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *)
                        0x111ae8);
    iVar2 = avcodec_parameters_to_context(pAVar4,pAVar3->streams[in_ESI]->codecpar);
    if (iVar2 == 0) {
      pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                         ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                          0x111b65);
      lVar5 = avcodec_find_decoder(pAVar4->codec_id);
      if (lVar5 != 0) {
        pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                           (in_stack_ffffffffffffff50);
        iVar2 = avcodec_open2(pAVar4,lVar5,0);
        if (-1 < iVar2) {
          pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x111cbf);
          AVar8 = pAVar4->codec_type;
          local_4 = in_ESI;
          if (AVar8 == AVMEDIA_TYPE_VIDEO) {
            pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::
                     operator->((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                                 *)0x111d26);
            *(AVStream **)(in_RDI + 0x280) = pAVar3->streams[in_ESI];
            std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator=
                      (in_stack_ffffffffffffff50,
                       (unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       CONCAT44(AVar8,in_stack_ffffffffffffff48));
          }
          else if (AVar8 == AVMEDIA_TYPE_AUDIO) {
            pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::
                     operator->((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                                 *)0x111ce9);
            *(AVStream **)(in_RDI + 0x30) = pAVar3->streams[in_ESI];
            std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator=
                      (in_stack_ffffffffffffff50,
                       (unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       CONCAT44(AVar8,in_stack_ffffffffffffff48));
          }
          else {
            local_4 = 0xffffffff;
          }
          goto LAB_00111d8c;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Unsupported codec: ");
      pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                         ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                          0x111bde);
      pcVar7 = (char *)avcodec_get_name(pAVar4->codec_id);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," (0x");
      this_00 = (void *)std::ostream::operator<<(poVar6,std::hex);
      pAVar4 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                         ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                          0x111c40);
      in_stack_ffffffffffffff60 =
           (unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
           std::ostream::operator<<(this_00,pAVar4->codec_id);
      poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff60,std::dec);
      poVar6 = std::operator<<(poVar6,")");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_4 = 0xffffffff;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
LAB_00111d8c:
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr
            (in_stack_ffffffffffffff60);
  return local_4;
}

Assistant:

int MovieState::streamComponentOpen(unsigned int stream_index)
{
    if(stream_index >= mFormatCtx->nb_streams)
        return -1;

    /* Get a pointer to the codec context for the stream, and open the
     * associated codec.
     */
    AVCodecCtxPtr avctx{avcodec_alloc_context3(nullptr)};
    if(!avctx) return -1;

    if(avcodec_parameters_to_context(avctx.get(), mFormatCtx->streams[stream_index]->codecpar))
        return -1;

    AVCodec *codec{avcodec_find_decoder(avctx->codec_id)};
    if(!codec || avcodec_open2(avctx.get(), codec, nullptr) < 0)
    {
        std::cerr<< "Unsupported codec: "<<avcodec_get_name(avctx->codec_id)
            << " (0x"<<std::hex<<avctx->codec_id<<std::dec<<")" <<std::endl;
        return -1;
    }

    /* Initialize and start the media type handler */
    switch(avctx->codec_type)
    {
        case AVMEDIA_TYPE_AUDIO:
            mAudio.mStream = mFormatCtx->streams[stream_index];
            mAudio.mCodecCtx = std::move(avctx);
            break;

        case AVMEDIA_TYPE_VIDEO:
            mVideo.mStream = mFormatCtx->streams[stream_index];
            mVideo.mCodecCtx = std::move(avctx);
            break;

        default:
            return -1;
    }

    return static_cast<int>(stream_index);
}